

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmder_.c
# Opt level: O0

void lmder_(minpack_funcder_mn fcnder_mn,int *m,int *n,double *x,double *fvec,double *fjac,
           int *ldfjac,double *ftol,double *xtol,double *gtol,int *maxfev,double *diag,int *mode,
           double *factor,int *nprint,int *info,int *nfev,int *njev,int *ipvt,double *qtf,
           double *wa1,double *wa2,double *wa3,double *wa4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *x_00;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *sdiag;
  double *par_00;
  long in_RCX;
  double *in_RDX;
  double *in_RSI;
  code *in_RDI;
  long in_R8;
  long in_R9;
  double dVar9;
  int *n_00;
  double dVar10;
  int *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  int *in_stack_00000028;
  long in_stack_00000030;
  int *in_stack_00000038;
  double *in_stack_00000040;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  double prered;
  double epsmch;
  double dirder;
  double actred;
  double fnorm1;
  double xnorm;
  double pnorm;
  double gnorm;
  double fnorm;
  double ratio;
  double delta;
  int iflag;
  double temp2;
  double temp1;
  double temp;
  int iter;
  double sum;
  double par;
  int l;
  int j;
  int i__;
  double d__3;
  double d__2;
  double d__1;
  int i__2;
  int i__1;
  int fjac_offset;
  int fjac_dim1;
  int c_true;
  int c__1;
  double *pdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double *local_140;
  double *local_130;
  double *local_128;
  double *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  int *pivot;
  double *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff30;
  double *local_c8;
  undefined4 in_stack_ffffffffffffff40;
  int iVar15;
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  int local_9c;
  double local_98;
  double local_90;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int iVar16;
  int iVar17;
  int iVar18;
  double *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined4 uVar19;
  int iVar20;
  
  iVar20 = 1;
  uVar19 = 1;
  pivot = (int *)0x0;
  lVar4 = (long)pnorm + -8;
  x_00 = (double *)(in_R8 + -8);
  lVar5 = (long)xnorm + -8;
  lVar6 = (long)fnorm1 + -8;
  lVar7 = (long)actred + -8;
  lVar8 = in_stack_00000030 + -8;
  sdiag = (double *)(in_RCX + -8);
  iVar1 = *in_stack_00000008;
  iVar3 = iVar1 + 1;
  par_00 = (double *)(in_R9 + (long)iVar3 * -8);
  dVar9 = dpmpar_((int *)&stack0xffffffffffffffb4);
  *in_stack_00000050 = 0;
  iVar15 = 0;
  *in_stack_00000058 = 0;
  *(undefined4 *)prered = 0;
  if ((((0 < *(int *)in_RDX) && (*(int *)in_RDX <= *(int *)in_RSI)) &&
      (*(int *)in_RSI <= *in_stack_00000008)) &&
     (((0.0 < *in_stack_00000010 || *in_stack_00000010 == 0.0 &&
       (0.0 < *in_stack_00000018 || *in_stack_00000018 == 0.0)) &&
      ((0.0 < *in_stack_00000020 || *in_stack_00000020 == 0.0 &&
       ((0 < *in_stack_00000028 && (0.0 < *in_stack_00000040)))))))) {
    if (*in_stack_00000038 == 2) {
      for (iVar17 = 1; iVar17 <= *(int *)in_RDX; iVar17 = iVar17 + 1) {
        if (*(double *)(lVar8 + (long)iVar17 * 8) <= 0.0) goto LAB_00103614;
      }
    }
    iVar15 = 1;
    (*in_RDI)(in_RSI,in_RDX,sdiag + 1,x_00 + 1,par_00 + iVar3,in_stack_00000008,
              &stack0xffffffffffffff44);
    *in_stack_00000058 = 1;
    if (-1 < iVar15) {
      n_00 = (int *)enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_90 = 0.0;
      local_9c = 1;
      while( true ) {
        iVar15 = 2;
        (*in_RDI)(in_RSI,in_RDX,sdiag + 1,x_00 + 1,par_00 + iVar3,in_stack_00000008,
                  &stack0xffffffffffffff44);
        *(int *)prered = *(int *)prered + 1;
        if (iVar15 < 0) break;
        if (0 < *in_stack_00000048) {
          iVar15 = 0;
          if ((local_9c + -1) % *in_stack_00000048 == 0) {
            (*in_RDI)(in_RSI,in_RDX,sdiag + 1,x_00 + 1,par_00 + iVar3,in_stack_00000008,
                      &stack0xffffffffffffff44);
          }
          if (iVar15 < 0) break;
        }
        qrfac_(in_stack_ffffffffffffff30,n_00,in_stack_ffffffffffffff20,
               (int *)in_stack_ffffffffffffff18,pivot,in_stack_ffffffffffffff08,
               (int *)CONCAT44(iVar15,in_stack_ffffffffffffff40),in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
        if (local_9c == 1) {
          if (*in_stack_00000038 != 2) {
            iVar17 = *(int *)in_RDX;
            for (iVar18 = 1; iVar18 <= iVar17; iVar18 = iVar18 + 1) {
              *(undefined8 *)(lVar8 + (long)iVar18 * 8) = *(undefined8 *)(lVar6 + (long)iVar18 * 8);
              dVar10 = *(double *)(lVar6 + (long)iVar18 * 8);
              if ((dVar10 == 0.0) && (!NAN(dVar10))) {
                *(undefined8 *)(lVar8 + (long)iVar18 * 8) = 0x3ff0000000000000;
              }
            }
          }
          iVar17 = *(int *)in_RDX;
          for (iVar18 = 1; iVar18 <= iVar17; iVar18 = iVar18 + 1) {
            *(double *)(lVar5 + (long)iVar18 * 8) =
                 *(double *)(lVar8 + (long)iVar18 * 8) * sdiag[iVar18];
          }
          pivot = (int *)enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          local_c8 = (double *)(*in_stack_00000040 * (double)pivot);
          if (((double)local_c8 == 0.0) && (!NAN((double)local_c8))) {
            local_c8 = (double *)*in_stack_00000040;
          }
        }
        iVar17 = *(int *)in_RSI;
        for (iVar18 = 1; iVar18 <= iVar17; iVar18 = iVar18 + 1) {
          *(double *)(lVar4 + (long)iVar18 * 8) = x_00[iVar18];
        }
        iVar17 = *(int *)in_RDX;
        for (iVar16 = 1; iVar16 <= iVar17; iVar16 = iVar16 + 1) {
          if ((par_00[iVar16 + iVar16 * iVar1] != 0.0) || (NAN(par_00[iVar16 + iVar16 * iVar1]))) {
            local_98 = 0.0;
            for (iVar18 = iVar16; iVar18 <= *(int *)in_RSI; iVar18 = iVar18 + 1) {
              local_98 = par_00[iVar18 + iVar16 * iVar1] * *(double *)(lVar4 + (long)iVar18 * 8) +
                         local_98;
            }
            in_stack_ffffffffffffff58 = (double *)(-local_98 / par_00[iVar16 + iVar16 * iVar1]);
            in_stack_ffffffffffffffa0 = *(int *)in_RSI;
            for (iVar18 = iVar16; iVar18 <= in_stack_ffffffffffffffa0; iVar18 = iVar18 + 1) {
              *(double *)(lVar4 + (long)iVar18 * 8) =
                   par_00[iVar18 + iVar16 * iVar1] * (double)in_stack_ffffffffffffff58 +
                   *(double *)(lVar4 + (long)iVar18 * 8);
            }
          }
          par_00[iVar16 + iVar16 * iVar1] = *(double *)(lVar7 + (long)iVar16 * 8);
          *(undefined8 *)((long)dirder + -8 + (long)iVar16 * 8) =
               *(undefined8 *)(lVar4 + (long)iVar16 * 8);
        }
        in_stack_ffffffffffffff20 = (double *)0x0;
        if (((double)n_00 != 0.0) || (NAN((double)n_00))) {
          iVar17 = *(int *)in_RDX;
          for (iVar16 = 1; iVar16 <= iVar17; iVar16 = iVar16 + 1) {
            in_stack_ffffffffffffff7c = *(int *)((long)epsmch + -4 + (long)iVar16 * 4);
            dVar10 = *(double *)(lVar6 + (long)in_stack_ffffffffffffff7c * 8);
            if ((dVar10 != 0.0) || (pdVar11 = in_stack_ffffffffffffff20, NAN(dVar10))) {
              local_98 = 0.0;
              for (iVar18 = 1; iVar18 <= iVar16; iVar18 = iVar18 + 1) {
                local_98 = par_00[iVar18 + iVar16 * iVar1] *
                           (*(double *)((long)dirder + -8 + (long)iVar18 * 8) / (double)n_00) +
                           local_98;
              }
              in_stack_ffffffffffffff88 =
                   (double *)
                   ABS(local_98 / *(double *)(lVar6 + (long)in_stack_ffffffffffffff7c * 8));
              pdVar11 = in_stack_ffffffffffffff88;
              in_stack_ffffffffffffff90 = in_stack_ffffffffffffff20;
              in_stack_ffffffffffffffa0 = iVar16;
              if ((double)in_stack_ffffffffffffff88 <= (double)in_stack_ffffffffffffff20) {
                pdVar11 = in_stack_ffffffffffffff20;
              }
            }
            in_stack_ffffffffffffff20 = pdVar11;
          }
        }
        if ((double)in_stack_ffffffffffffff20 <= *in_stack_00000020) {
          *in_stack_00000050 = 4;
        }
        if (*in_stack_00000050 != 0) break;
        if (*in_stack_00000038 != 2) {
          iVar17 = *(int *)in_RDX;
          for (iVar16 = 1; iVar16 <= iVar17; iVar16 = iVar16 + 1) {
            in_stack_ffffffffffffff98 = *(double **)(lVar8 + (long)iVar16 * 8);
            in_stack_ffffffffffffff90 = *(double **)(lVar6 + (long)iVar16 * 8);
            local_128 = in_stack_ffffffffffffff90;
            if ((double)in_stack_ffffffffffffff90 <= (double)in_stack_ffffffffffffff98) {
              local_128 = in_stack_ffffffffffffff98;
            }
            *(double **)(lVar8 + (long)iVar16 * 8) = local_128;
          }
        }
        do {
          pdVar11 = &local_90;
          dVar10 = actred;
          dVar12 = fnorm1;
          dVar13 = xnorm;
          dVar14 = pnorm;
          lmpar_((int *)CONCAT44(iVar17,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                 (int *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                 (double *)CONCAT44(iVar18,iVar16),
                 (double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (double *)CONCAT44(iVar20,uVar19),par_00,x_00,sdiag,in_RDX,in_RSI);
          iVar15 = *(int *)in_RDX;
          for (iVar17 = 1; iVar17 <= iVar15; iVar17 = iVar17 + 1) {
            *(ulong *)(lVar7 + (long)iVar17 * 8) =
                 *(ulong *)(lVar7 + (long)iVar17 * 8) ^ 0x8000000000000000;
            *(double *)(lVar6 + (long)iVar17 * 8) =
                 sdiag[iVar17] + *(double *)(lVar7 + (long)iVar17 * 8);
            *(double *)(lVar5 + (long)iVar17 * 8) =
                 *(double *)(lVar8 + (long)iVar17 * 8) * *(double *)(lVar7 + (long)iVar17 * 8);
          }
          in_stack_ffffffffffffff18 =
               (double *)enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          if (local_9c == 1) {
            local_130 = in_stack_ffffffffffffff18;
            if ((double)local_c8 <= (double)in_stack_ffffffffffffff18) {
              local_130 = local_c8;
            }
            local_c8 = local_130;
          }
          iVar15 = 1;
          (*in_RDI)(in_RSI,in_RDX,fnorm1,pnorm,par_00 + iVar3,in_stack_00000008,
                    &stack0xffffffffffffff44,pdVar11,dVar10,dVar12,dVar13,dVar14);
          *in_stack_00000058 = *in_stack_00000058 + 1;
          if (iVar15 < 0) goto LAB_00103614;
          in_stack_ffffffffffffff08 =
               (int *)enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          in_stack_ffffffffffffff00 = (int *)0xbff0000000000000;
          if ((double)in_stack_ffffffffffffff08 * 0.1 < (double)n_00) {
            in_stack_ffffffffffffff00 =
                 (int *)(-((double)in_stack_ffffffffffffff08 / (double)n_00) *
                         ((double)in_stack_ffffffffffffff08 / (double)n_00) + 1.0);
          }
          iVar17 = *(int *)in_RDX;
          iVar2 = 1;
          while (iVar16 = iVar2, iVar16 <= iVar17) {
            *(undefined8 *)(lVar5 + (long)iVar16 * 8) = 0;
            in_stack_ffffffffffffff7c = *(int *)((long)epsmch + -4 + (long)iVar16 * 4);
            in_stack_ffffffffffffff58 = *(double **)(lVar7 + (long)in_stack_ffffffffffffff7c * 8);
            for (iVar18 = 1; iVar18 <= iVar16; iVar18 = iVar18 + 1) {
              *(double *)(lVar5 + (long)iVar18 * 8) =
                   par_00[iVar18 + iVar16 * iVar1] * (double)in_stack_ffffffffffffff58 +
                   *(double *)(lVar5 + (long)iVar18 * 8);
            }
            in_stack_ffffffffffffffa0 = iVar16;
            iVar2 = iVar16 + 1;
          }
          dVar10 = enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          in_stack_ffffffffffffff50 = (double *)(dVar10 / (double)n_00);
          dVar10 = sqrt(local_90);
          in_stack_ffffffffffffff48 =
               (double *)((dVar10 * (double)in_stack_ffffffffffffff18) / (double)n_00);
          dVar10 = (double)in_stack_ffffffffffffff50 * (double)in_stack_ffffffffffffff50 +
                   ((double)in_stack_ffffffffffffff48 * (double)in_stack_ffffffffffffff48) / 0.5;
          in_stack_fffffffffffffef8 =
               (double *)
               -((double)in_stack_ffffffffffffff50 * (double)in_stack_ffffffffffffff50 +
                (double)in_stack_ffffffffffffff48 * (double)in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff30 = (int *)0x0;
          if ((dVar10 != 0.0) || (NAN(dVar10))) {
            in_stack_ffffffffffffff30 = (int *)((double)in_stack_ffffffffffffff00 / dVar10);
          }
          if ((double)in_stack_ffffffffffffff30 <= 0.25) {
            if ((double)in_stack_ffffffffffffff00 < 0.0) {
              in_stack_ffffffffffffff58 =
                   (double *)
                   (((double)in_stack_fffffffffffffef8 * 0.5) /
                   ((double)in_stack_ffffffffffffff00 * 0.5 + (double)in_stack_fffffffffffffef8));
            }
            else {
              in_stack_ffffffffffffff58 = (double *)0x3fe0000000000000;
            }
            if (((double)n_00 <= (double)in_stack_ffffffffffffff08 * 0.1) ||
               ((double)in_stack_ffffffffffffff58 < 0.1)) {
              in_stack_ffffffffffffff58 = (double *)0x3fb999999999999a;
            }
            in_stack_ffffffffffffff90 = (double *)((double)in_stack_ffffffffffffff18 / 0.1);
            local_140 = in_stack_ffffffffffffff90;
            if ((double)local_c8 <= (double)in_stack_ffffffffffffff90) {
              local_140 = local_c8;
            }
            local_90 = local_90 / (double)in_stack_ffffffffffffff58;
            pdVar11 = (double *)((double)in_stack_ffffffffffffff58 * (double)local_140);
            in_stack_ffffffffffffff98 = local_c8;
          }
          else {
            in_stack_ffffffffffffff90 = in_stack_ffffffffffffff48;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff50;
            if (((local_90 == 0.0) && (!NAN(local_90))) ||
               (pdVar11 = local_c8, 0.75 <= (double)in_stack_ffffffffffffff30)) {
              local_90 = local_90 * 0.5;
              pdVar11 = (double *)((double)in_stack_ffffffffffffff18 / 0.5);
            }
          }
          local_c8 = pdVar11;
          if (0.0001 <= (double)in_stack_ffffffffffffff30) {
            iVar17 = *(int *)in_RDX;
            for (iVar16 = 1; iVar16 <= iVar17; iVar16 = iVar16 + 1) {
              sdiag[iVar16] = *(double *)(lVar6 + (long)iVar16 * 8);
              *(double *)(lVar6 + (long)iVar16 * 8) =
                   *(double *)(lVar8 + (long)iVar16 * 8) * sdiag[iVar16];
            }
            iVar17 = *(int *)in_RSI;
            for (iVar18 = 1; iVar18 <= iVar17; iVar18 = iVar18 + 1) {
              x_00[iVar18] = *(double *)(lVar4 + (long)iVar18 * 8);
            }
            pivot = (int *)enorm_(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
            local_9c = local_9c + 1;
            n_00 = in_stack_ffffffffffffff08;
          }
          if (((ABS((double)in_stack_ffffffffffffff00) <= *in_stack_00000010) &&
              (dVar10 <= *in_stack_00000010)) && ((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0)) {
            *in_stack_00000050 = 1;
          }
          if ((double)local_c8 <= *in_stack_00000018 * (double)pivot) {
            *in_stack_00000050 = 2;
          }
          if (((ABS((double)in_stack_ffffffffffffff00) <= *in_stack_00000010) &&
              (dVar10 <= *in_stack_00000010)) &&
             (((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0 && (*in_stack_00000050 == 2)))) {
            *in_stack_00000050 = 3;
          }
          if (*in_stack_00000050 != 0) goto LAB_00103614;
          if (*in_stack_00000028 <= *in_stack_00000058) {
            *in_stack_00000050 = 5;
          }
          if (((ABS((double)in_stack_ffffffffffffff00) <= dVar9) && (dVar10 <= dVar9)) &&
             ((double)in_stack_ffffffffffffff30 * 0.5 <= 1.0)) {
            *in_stack_00000050 = 6;
          }
          if ((double)local_c8 <= dVar9 * (double)pivot) {
            *in_stack_00000050 = 7;
          }
          if ((double)in_stack_ffffffffffffff20 <= dVar9) {
            *in_stack_00000050 = 8;
          }
          if (*in_stack_00000050 != 0) goto LAB_00103614;
        } while ((double)in_stack_ffffffffffffff30 < 0.0001);
      }
    }
  }
LAB_00103614:
  if (iVar15 < 0) {
    *in_stack_00000050 = iVar15;
  }
  if (0 < *in_stack_00000048) {
    (*in_RDI)(in_RSI,in_RDX,sdiag + 1,x_00 + 1,par_00 + iVar3,in_stack_00000008,
              &stack0xffffffffffffff44);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(lmder)(__minpack_decl_fcnder_mn__ const int *m, const int *n, real *x, 
	real *fvec, real *fjac, const int *ldfjac, const real *ftol,
	const real *xtol, const real *gtol, const int *maxfev, real *
	diag, const int *mode, const real *factor, const int *nprint, int *
	info, int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Table of constant values */

    const int c__1 = 1;
    const int c_true = TRUE_;

    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, l;
    real par, sum;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0, fnorm1, actred, dirder, 
	    epsmch, prered;

/*     ********** */

/*     subroutine lmder */

/*     the purpose of lmder is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmder(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjac,ldfjac,iflag) */
/*         integer m,n,ldfjac,iflag */
/*         double precision x(n),fvec(m),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmder. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.).100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x, fvec, and fjac */
/*         available for printing. fvec and fjac should not be */
/*         altered. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --fvec;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --ipvt;
    --diag;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *m < *n || *ldfjac < *m || *ftol < 0. || *xtol < 0. || 
	    *gtol < 0. || *maxfev <= 0 || *factor <= 0.) {
	goto L300;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L300;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L300;
    }
    fnorm = __minpack_func__(enorm)(m, &fvec[1]);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

L30:

/*        calculate the jacobian matrix. */

    iflag = 2;
    fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*njev);
    if (iflag < 0) {
	goto L300;
    }

/*        if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L40;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    if (iflag < 0) {
	goto L300;
    }
L40:

/*        compute the qr factorization of the jacobian. */

    __minpack_func__(qrfac)(m, n, &fjac[fjac_offset], ldfjac, &c_true, &ipvt[1], n, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L80;
    }
    if (*mode == 2) {
	goto L60;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L50: */
    }
L60:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L70: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L80:

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	wa4[i__] = fvec[i__];
/* L90: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L120;
	}
	sum = 0.;
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/* L100: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    wa4[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L110: */
	}
L120:
	fjac[j + j * fjac_dim1] = wa1[j];
	qtf[j] = wa4[j];
/* L130: */
    }

/*        compute the norm of the scaled gradient. */

    gnorm = 0.;
    if (fnorm == 0.) {
	goto L170;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	if (wa2[l] == 0.) {
	    goto L150;
	}
	sum = 0.;
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * (qtf[i__] / fnorm);
/* L140: */
	}
/* Computing MAX */
	d__2 = gnorm, d__3 = fabs(sum / wa2[l]);
	gnorm = max(d__2,d__3);
L150:
/* L160: */
	;
    }
L170:

/*        test for convergence of the gradient norm. */

    if (gnorm <= *gtol) {
	*info = 4;
    }
    if (*info != 0) {
	goto L300;
    }

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L190;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L180: */
    }
L190:

/*        beginning of the inner loop. */

L200:

/*           determine the levenberg-marquardt parameter. */

    __minpack_func__(lmpar)(n, &fjac[fjac_offset], ldfjac, &ipvt[1], &diag[1], &qtf[1], &delta,
	     &par, &wa1[1], &wa2[1], &wa3[1], &wa4[1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L210: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnder_mn(m, n, &wa2[1], &wa4[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L300;
    }
    fnorm1 = __minpack_func__(enorm)(m, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (p1 * fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = 0.;
	l = ipvt[j];
	temp = wa1[l];
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    wa3[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L220: */
	}
/* L230: */
    }
    temp1 = __minpack_func__(enorm)(n, &wa3[1]) / fnorm;
    temp2 = sqrt(par) * pnorm / fnorm;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    prered = d__1 * d__1 + d__2 * d__2 / p5;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    dirder = -(d__1 * d__1 + d__2 * d__2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered != 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio > p25) {
	goto L240;
    }
    if (actred >= 0.) {
	temp = p5;
    } else {
	temp = p5 * dirder / (dirder + p5 * actred);
    }
    if (p1 * fnorm1 >= fnorm || temp < p1) {
	temp = p1;
    }
/* Computing MIN */
    d__1 = delta, d__2 = pnorm / p1;
    delta = temp * min(d__1,d__2);
    par /= temp;
    goto L260;
L240:
    if (par != 0. && ratio < p75) {
	goto L250;
    }
    delta = pnorm / p5;
    par = p5 * par;
L250:
L260:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L290;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
/* L270: */
    }
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	fvec[i__] = wa4[i__];
/* L280: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L290:

/*           tests for convergence. */

    if (fabs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1.) {
	*info = 1;
    }
    if (delta <= *xtol * xnorm) {
	*info = 2;
    }
    if (fabs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1. && *info 
	    == 2) {
	*info = 3;
    }
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 5;
    }
    if (fabs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
	*info = 6;
    }
    if (delta <= epsmch * xnorm) {
	*info = 7;
    }
    if (gnorm <= epsmch) {
	*info = 8;
    }
    if (*info != 0) {
	goto L300;
    }

/*           end of the inner loop. repeat if iteration unsuccessful. */

    if (ratio < p0001) {
	goto L200;
    }

/*        end of the outer loop. */

    goto L30;
L300:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    return;

/*     last card of subroutine lmder. */

}